

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_access.h
# Opt level: O2

int __thiscall
Gudhi::persistence_matrix::
Row_access<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
::unlink(Row_access<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>
         *this,char *__name)

{
  long *plVar1;
  long in_RAX;
  
  if ((this->rows_ != (Row_container *)0x0) && (in_RAX = *(long *)(__name + 8), in_RAX != 0)) {
    plVar1 = *(long **)(__name + 0x10);
    *plVar1 = in_RAX;
    *(long **)(in_RAX + 8) = plVar1;
    __name[8] = '\0';
    __name[9] = '\0';
    __name[10] = '\0';
    __name[0xb] = '\0';
    __name[0xc] = '\0';
    __name[0xd] = '\0';
    __name[0xe] = '\0';
    __name[0xf] = '\0';
    __name[0x10] = '\0';
    __name[0x11] = '\0';
    __name[0x12] = '\0';
    __name[0x13] = '\0';
    __name[0x14] = '\0';
    __name[0x15] = '\0';
    __name[0x16] = '\0';
    __name[0x17] = '\0';
  }
  return (int)in_RAX;
}

Assistant:

inline void Row_access<Master_matrix>::unlink(Matrix_entry* entry) 
{
  if (rows_ == nullptr) return;

  if constexpr (Master_matrix::Option_list::has_intrusive_rows) {
    entry->Base_hook_matrix_row::unlink();
  } else {
    if constexpr (Master_matrix::Option_list::has_removable_rows) {
      auto it = rows_->find(entry->get_row_index());
      it->second.erase(*entry);
    } else {
      rows_->operator[](entry->get_row_index()).erase(*entry);
    }
  }
}